

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

void __thiscall
S2Polyline::Init(S2Polyline *this,
                vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  Vector3<double> *pVVar1;
  pointer __src;
  undefined1 auVar2 [16];
  ulong uVar3;
  bool bVar4;
  Vector3<double> *__s;
  int iVar5;
  size_t __n;
  ulong uVar6;
  S2LogMessage SStack_38;
  
  uVar3 = ((long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar5 = (int)uVar3;
  this->num_vertices_ = iVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar5;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
    uVar6 = SUB168(auVar2 * ZEXT816(0x18),0);
  }
  __s = (Vector3<double> *)operator_new__(uVar6);
  if ((uVar3 & 0xffffffff) != 0) {
    memset(__s,0,(((long)iVar5 * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  pVVar1 = (this->vertices_)._M_t.
           super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
           super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
           super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = __s;
  if (pVVar1 != (Vector3<double> *)0x0) {
    operator_delete__(pVVar1);
  }
  __src = (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
          .super__Vector_impl_data._M_start;
  __n = (long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove((this->vertices_)._M_t.
            super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
            super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
            super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl,__src,__n);
  }
  if ((FLAGS_s2debug == true) && (this->s2debug_override_ == ALLOW)) {
    bVar4 = IsValid(this);
    if (!bVar4) {
      S2LogMessage::S2LogMessage
                (&SStack_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
                 ,0x66,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_38.stream_,"Check failed: IsValid() ",0x18);
      abort();
    }
  }
  return;
}

Assistant:

void S2Polyline::Init(const vector<S2Point>& vertices) {
  num_vertices_ = vertices.size();
  vertices_.reset(new S2Point[num_vertices_]);
  std::copy(vertices.begin(), vertices.end(), &vertices_[0]);
  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    S2_CHECK(IsValid());
  }
}